

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iomapper.cpp
# Opt level: O3

int __thiscall
glslang::TDefaultIoResolverBase::reserveSlot(TDefaultIoResolverBase *this,int set,int slot,int size)

{
  iterator __position;
  mapped_type *pmVar1;
  undefined4 in_register_00000014;
  int iVar2;
  ulong uVar3;
  int iVar4;
  int iVar5;
  int local_44;
  ulong local_40;
  int local_34;
  
  local_40 = CONCAT44(in_register_00000014,slot);
  local_44 = set;
  __position = findSlot(this,set,slot);
  if (0 < size) {
    iVar5 = 0;
    uVar3 = local_40 & 0xffffffff;
    do {
      pmVar1 = std::__detail::
               _Map_base<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&this->slots,&local_44);
      iVar2 = (int)uVar3;
      iVar4 = iVar2;
      if (__position._M_current ==
          (pmVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_finish) {
LAB_00471b5a:
        pmVar1 = std::__detail::
                 _Map_base<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)&this->slots,&local_44);
        local_34 = iVar4;
        __position = std::vector<int,_std::allocator<int>_>::_M_insert_rval
                               (pmVar1,__position._M_current,&local_34);
      }
      else if (iVar2 != *__position._M_current) {
        iVar4 = (int)local_40 + iVar5;
        goto LAB_00471b5a;
      }
      __position._M_current = __position._M_current + 1;
      iVar5 = iVar5 + 1;
      uVar3 = (ulong)(iVar2 + 1);
      size = size + -1;
    } while (size != 0);
  }
  return (int)local_40;
}

Assistant:

int TDefaultIoResolverBase::reserveSlot(int set, int slot, int size) {
    TSlotSet::iterator at = findSlot(set, slot);
    // tolerate aliasing, by not double-recording aliases
    // (policy about appropriateness of the alias is higher up)
    for (int i = 0; i < size; i++) {
        if (at == slots[set].end() || *at != slot + i)
            at = slots[set].insert(at, slot + i);
        ++at;
    }
    return slot;
}